

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

bool __thiscall Js::JavascriptSet::DeleteFromVarSet<false>(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var local_28;
  Var value_local;
  SetDataNode *node;
  
  local_28 = value;
  if (this->kind != SimpleVarSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1ef,
                                "(this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet))"
                                ,
                                "this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  value_local = (Var)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    ((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this->u,&local_28,(MapOrSetDataNode<void_*> **)&value_local);
  if (bVar2) {
    MapOrSetDataList<void_*>::Remove(&this->list,(MapOrSetDataNode<void_*> *)value_local);
  }
  return bVar2;
}

Assistant:

bool
JavascriptSet::DeleteFromVarSet(Var value)
{
    Assert(this->kind == (isComplex ? SetKind::ComplexVarSet : SetKind::SimpleVarSet));
    SetDataNode * node = nullptr;
    if (isComplex
        ? !this->u.complexVarSet->TryGetValueAndRemove(value, &node)
        : !this->u.simpleVarSet->TryGetValueAndRemove(value, &node))
    {
        return false;
    }

    this->list.Remove(node);
    return true;
}